

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_mem.c
# Opt level: O0

void * custom_realloc(void *ptr,size_t size)

{
  size_t size_local;
  void *ptr_local;
  
  if (ptr == (void *)0x0) {
    if (size == 0) {
      ptr_local = (void *)0x0;
    }
    else {
      ptr_local = calloc(1,size);
    }
  }
  else if (size == 0) {
    free(ptr);
    ptr_local = (void *)0x0;
  }
  else {
    ptr_local = realloc(ptr,size);
  }
  return ptr_local;
}

Assistant:

static void *custom_realloc(void *ptr, size_t size) {
	if (!ptr) {
		if (!size)
			return NULL;
		return calloc(1, size);
	}
	if (size)
		return realloc(ptr, size);
	free(ptr);
	return NULL;
}